

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFreloc.c
# Opt level: O0

int lookup_linkmap(NF_link_map *l,char *name,rela_result *result,ProxyRecord *records)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint_fast32_t uVar5;
  ulong uVar6;
  char *symname;
  Elf32_Word *hasharr;
  Elf32_Word bucket;
  uint hashbit2;
  uint hashbit1;
  Elf64_Addr bitmask_word;
  uint32_t symidx;
  Elf64_Addr *bitmask;
  Elf64_Sym *sym;
  uint_fast32_t new_hash;
  Elf64_Sym *symtab;
  char *strtab;
  Elf64_Dyn *dyn;
  int i;
  ProxyRecord *records_local;
  rela_result *result_local;
  char *name_local;
  NF_link_map *l_local;
  
  dyn._4_4_ = 0;
  while (records[dyn._4_4_].pointer != (void *)0x0) {
    iVar4 = strcmp(records[dyn._4_4_].name,name);
    if (iVar4 == 0) {
      result->addr = (Elf64_Addr)records[dyn._4_4_].pointer;
      return 1;
    }
    dyn._4_4_ = dyn._4_4_ + 1;
  }
  for (strtab = (char *)l->l_ld; *(long *)strtab != 5; strtab = strtab + 0x10) {
  }
  lVar2 = *(long *)(strtab + 8);
  for (; *(long *)strtab != 6; strtab = strtab + 0x10) {
  }
  lVar3 = *(long *)(strtab + 8);
  uVar5 = dl_new_hash(name);
  if (((l->l_gnu_bitmask[uVar5 >> 6 & (ulong)l->l_gnu_bitmask_idxbits] >> ((byte)uVar5 & 0x3f) &
        l->l_gnu_bitmask[uVar5 >> 6 & (ulong)l->l_gnu_bitmask_idxbits] >>
        ((byte)(uVar5 >> ((byte)l->l_gnu_shift & 0x3f)) & 0x3f) & 1) != 0) &&
     (l->l_gnu_buckets[uVar5 % (ulong)l->l_nbuckets] != 0)) {
    symname = (char *)(l->l_gnu_chain_zero + l->l_gnu_buckets[uVar5 % (ulong)l->l_nbuckets]);
    do {
      if ((*(uint *)symname ^ uVar5) >> 1 == 0) {
        uVar6 = (long)symname - (long)l->l_gnu_chain_zero >> 2;
        iVar4 = strcmp((char *)(lVar2 + (ulong)*(uint *)(lVar3 + (uVar6 & 0xffffffff) * 0x18)),name)
        ;
        if (iVar4 == 0) {
          result->s = (Elf64_Sym *)(lVar3 + (uVar6 & 0xffffffff) * 0x18);
          result->addr = result->s->st_value + l->l_addr;
          return 1;
        }
      }
      uVar1 = *(uint *)symname;
      symname = symname + 4;
    } while ((uVar1 & 1) == 0);
  }
  return 0;
}

Assistant:

static int lookup_linkmap(struct NF_link_map *l, const char *name, struct rela_result *result, const ProxyRecord *records)
{
    for (int i = 0; records[i].pointer; i += 1)
    {
        if (strcmp(records[i].name, name) == 0)
        {
            result->addr = (Elf64_Addr)records[i].pointer;
            return 1;
        }
    }

    /* search the symbol table of given link_map to find the occurrence of the symbol
        return 1 upon success and 0 otherwise */
    Elf64_Dyn *dyn = l->l_ld;
    while (dyn->d_tag != DT_STRTAB)
        ++dyn;
    /* string table is in a flatten char array */
    const char *strtab = (void *)dyn->d_un.d_ptr;
    while (dyn->d_tag != DT_SYMTAB)
        ++dyn;
    /* dyn is now at the symbol table entry */
    /* note that only dynamic symbol table will be mapped, and DT_SYMTAB also implies the dynamic one */
    Elf64_Sym *symtab = (void *)dyn->d_un.d_ptr;

    /* playing with hash table here, borrowed from dl-lookup.c */
    /* But first of all, re-set the hash table here */
    /* we don't need to rebuild the hash because we're relocating with NF_link_map now */
    //struct hash_table h;
    //rebuild_hash(l, &h);

    uint_fast32_t new_hash = dl_new_hash(name);
    Elf64_Sym *sym;
    const Elf64_Addr *bitmask = l->l_gnu_bitmask;
    uint32_t symidx;

    Elf64_Addr bitmask_word = bitmask[(new_hash / __ELF_NATIVE_CLASS) & l->l_gnu_bitmask_idxbits];
    unsigned int hashbit1 = new_hash & (__ELF_NATIVE_CLASS - 1);
    unsigned int hashbit2 = ((new_hash >> l->l_gnu_shift) & (__ELF_NATIVE_CLASS - 1));
    if ((bitmask_word >> hashbit1) & (bitmask_word >> hashbit2) & 1)
    {
        Elf32_Word bucket = l->l_gnu_buckets[new_hash % l->l_nbuckets];
        if (bucket != 0)
        {
            const Elf32_Word *hasharr = &l->l_gnu_chain_zero[bucket];
            do
            {
                if (((*hasharr ^ new_hash) >> 1) == 0)
                {
                    symidx = hasharr - l->l_gnu_chain_zero;
                    /* now, symtab[symidx] is the current symbol
                        hash table has done all work and can be stripped */
                    const char *symname = strtab + symtab[symidx].st_name;
                    /* FIXME: You may also want to check the visibility and strong/weak of the found symbol
                        but... not now */
                    /* FIXME: Please make sure no local symbols like "tmp" will be accessed here! */
                    if (!strcmp(symname, name))
                    {
                        result->s = &symtab[symidx];
                        result->addr = result->s->st_value + l->l_addr;
                        return 1;
                    }
                }
            } while ((*hasharr++ & 1u) == 0);
        }
    }
    return 0; //not this link_map
}